

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

Token * __thiscall inja::Lexer::scan_id(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  size_type sVar4;
  const_reference pcVar5;
  char ch;
  Lexer *this_local;
  
  while (uVar2 = this->m_pos,
        sVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in)
        , uVar2 < sVar4) {
    pcVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&this->m_in,this->m_pos);
    cVar1 = *pcVar5;
    iVar3 = isalnum((int)cVar1);
    if ((((iVar3 == 0) && (cVar1 != '.')) && (cVar1 != '/')) && ((cVar1 != '_' && (cVar1 != '-'))))
    break;
    this->m_pos = this->m_pos + 1;
  }
  make_token(__return_storage_ptr__,this,Id);
  return __return_storage_ptr__;
}

Assistant:

Token scan_id() {
		for (;;) {
			if (m_pos >= m_in.size()) {
				break;
			}
			char ch = m_in[m_pos];
			if (!std::isalnum(ch) && ch != '.' && ch != '/' && ch != '_' && ch != '-') {
				break;
			}
			m_pos += 1;
		}
		return make_token(Token::Kind::Id);
	}